

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

string * __thiscall
Catch::AssertionResult::getExpressionInMacro_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  char *pcVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->m_info).macroName.m_size == 0) {
    pcVar1 = (this->m_info).capturedExpression.m_start;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,pcVar1,pcVar1 + (this->m_info).capturedExpression.m_size);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  else {
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::append
              ((char *)__return_storage_ptr__,(ulong)(this->m_info).macroName.m_start);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append
              ((char *)__return_storage_ptr__,(ulong)(this->m_info).capturedExpression.m_start);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpressionInMacro() const {
        std::string expr;
        if( m_info.macroName.empty() )
            expr = static_cast<std::string>(m_info.capturedExpression);
        else {
            expr.reserve( m_info.macroName.size() + m_info.capturedExpression.size() + 4 );
            expr += m_info.macroName;
            expr += "( ";
            expr += m_info.capturedExpression;
            expr += " )";
        }
        return expr;
    }